

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall
helics::CoreBroker::findAndNotifyEndpointTargets
          (CoreBroker *this,BasicHandleInfo *handleInfo,string *key)

{
  string_view name;
  bool bVar1;
  BrokerState BVar2;
  reference ppVar3;
  BasicHandleInfo *pBVar4;
  string *in_RSI;
  unsigned_short destFlags_1;
  BasicHandleInfo *iface_1;
  pair<helics::GlobalHandle,_unsigned_short> *target_1;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
  *__range2;
  ActionMessage link;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ept;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  eptTargets;
  unsigned_short destFlags;
  ActionMessage *in_stack_000001f8;
  CoreBroker *in_stack_00000200;
  BasicHandleInfo *iface;
  pair<helics::GlobalHandle,_unsigned_short> *target;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
  *__range1;
  vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
  uHandles;
  string *in_stack_fffffffffffffd98;
  uint in_stack_fffffffffffffda0;
  unsigned_short in_stack_fffffffffffffda4;
  uint16_t in_stack_fffffffffffffda6;
  UnknownHandleManager *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  uint in_stack_fffffffffffffdb4;
  GlobalHandle in_stack_fffffffffffffdb8;
  undefined6 in_stack_fffffffffffffdc0;
  undefined2 in_stack_fffffffffffffdc6;
  ushort local_1d2;
  __normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
  local_1b0;
  undefined1 *local_1a8;
  GlobalHandle local_188;
  __sv_type local_180;
  uint16_t local_158;
  uint32_t in_stack_fffffffffffffefc;
  BasicHandleInfo *in_stack_ffffffffffffff00;
  uint32_t in_stack_ffffffffffffff0c;
  BasicHandleInfo *in_stack_ffffffffffffff10;
  CoreBroker *in_stack_ffffffffffffff18;
  pair<helics::action_message_def::action_t,_helics::action_message_def::action_t>
  in_stack_ffffffffffffff20;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a8;
  undefined1 *local_a0;
  undefined1 local_98 [24];
  undefined4 local_80;
  undefined4 local_7c;
  pair<helics::action_message_def::action_t,_helics::action_message_def::action_t> local_78;
  uint16_t local_6e;
  GlobalHandle local_60;
  BasicHandleInfo *local_58;
  reference local_50;
  pair<helics::GlobalHandle,_unsigned_short> *local_48;
  __normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
  local_40;
  undefined1 *local_38;
  undefined1 local_30 [32];
  string *local_10;
  
  local_10 = in_RSI;
  UnknownHandleManager::checkForEndpoints
            (in_stack_fffffffffffffda8,
             (string *)
             CONCAT26(in_stack_fffffffffffffda6,
                      CONCAT24(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0)));
  local_38 = local_30;
  local_40._M_current =
       (pair<helics::GlobalHandle,_unsigned_short> *)
       CLI::std::
       vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
       ::begin((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                *)in_stack_fffffffffffffd98);
  local_48 = (pair<helics::GlobalHandle,_unsigned_short> *)
             CLI::std::
             vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
             ::end((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                    *)in_stack_fffffffffffffd98);
  while (bVar1 = __gnu_cxx::
                 operator==<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
                           ((__normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
                             *)CONCAT26(in_stack_fffffffffffffda6,
                                        CONCAT24(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0
                                                )),
                            (__normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
                             *)in_stack_fffffffffffffd98), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_50 = __gnu_cxx::
               __normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
               ::operator*(&local_40);
    local_60 = local_50->first;
    local_58 = HandleManager::findHandle
                         ((HandleManager *)
                          CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                          in_stack_fffffffffffffdb8);
    local_6e = local_50->second;
    if (local_58->handleType != FILTER) {
      local_6e = toggle_flag(in_stack_fffffffffffffda6,in_stack_fffffffffffffda0);
    }
    local_7c = 0x5a;
    local_80 = 0x3e;
    if (local_58->handleType != FILTER) {
      local_80 = 0x5a;
    }
    local_78 = std::
               make_pair<helics::action_message_def::action_t,helics::action_message_def::action_t>
                         ((action_t *)in_stack_fffffffffffffd98,(action_t *)0x5ec9f1);
    connectInterfaces(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
                      in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_ffffffffffffff20)
    ;
    __gnu_cxx::
    __normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
    ::operator++(&local_40);
  }
  UnknownHandleManager::checkForEndpointLinks
            (in_stack_fffffffffffffda8,
             (string *)
             CONCAT26(in_stack_fffffffffffffda6,
                      CONCAT24(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0)));
  local_a0 = local_98;
  local_a8._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       CLI::std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffd98);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)in_stack_fffffffffffffd98);
  while (bVar1 = __gnu_cxx::
                 operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)CONCAT26(in_stack_fffffffffffffda6,
                                        CONCAT24(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0
                                                )),
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffd98), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*(&local_a8);
    ActionMessage::ActionMessage
              ((ActionMessage *)CONCAT26(in_stack_fffffffffffffdc6,in_stack_fffffffffffffdc0),
               in_stack_fffffffffffffdb8.handle.hid.hid);
    local_180 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT26(in_stack_fffffffffffffda6,
                                    CONCAT24(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0)));
    name._M_str._0_4_ = in_stack_fffffffffffffda0;
    name._M_len = (size_t)in_stack_fffffffffffffd98;
    name._M_str._4_2_ = in_stack_fffffffffffffda4;
    name._M_str._6_2_ = in_stack_fffffffffffffda6;
    ActionMessage::name((ActionMessage *)0x5ecb20,name);
    local_188 = (GlobalHandle)
                (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_10->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start;
    ActionMessage::setSource((ActionMessage *)&stack0xfffffffffffffe90,local_188);
    setActionFlag<helics::ActionMessage,helics::InterfaceFlags>
              ((ActionMessage *)&stack0xfffffffffffffe90,destination_target);
    local_158 = 0x65;
    checkForNamedInterface(in_stack_00000200,in_stack_000001f8);
    ActionMessage::~ActionMessage
              ((ActionMessage *)
               CONCAT26(in_stack_fffffffffffffda6,
                        CONCAT24(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0)));
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_a8);
  }
  bVar1 = CLI::std::
          vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
          ::empty((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                   *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  if ((!bVar1) ||
     (bVar1 = CLI::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0)), !bVar1)) {
    UnknownHandleManager::clearEndpoint
              ((UnknownHandleManager *)
               CONCAT26(in_stack_fffffffffffffda6,
                        CONCAT24(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0)),
               in_stack_fffffffffffffd98);
  }
  BVar2 = BrokerBase::getBrokerState((BrokerBase *)0x5ecc2b);
  if (BVar2 == OPERATING) {
    UnknownHandleManager::checkForReconnectionEndpoints
              (in_stack_fffffffffffffda8,
               (string *)
               CONCAT26(in_stack_fffffffffffffda6,
                        CONCAT24(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0)));
    CLI::std::
    vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
    ::operator=((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                 *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                (vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                 *)in_stack_fffffffffffffda8);
    CLI::std::
    vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
    ::~vector((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
               *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
    local_1a8 = local_30;
    local_1b0._M_current =
         (pair<helics::GlobalHandle,_unsigned_short> *)
         CLI::std::
         vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
         ::begin((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                  *)in_stack_fffffffffffffd98);
    CLI::std::
    vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
    ::end((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
           *)in_stack_fffffffffffffd98);
    while (bVar1 = __gnu_cxx::
                   operator==<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
                             ((__normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
                               *)CONCAT26(in_stack_fffffffffffffda6,
                                          CONCAT24(in_stack_fffffffffffffda4,
                                                   in_stack_fffffffffffffda0)),
                              (__normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
                               *)in_stack_fffffffffffffd98), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppVar3 = __gnu_cxx::
               __normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
               ::operator*(&local_1b0);
      pBVar4 = HandleManager::findHandle
                         ((HandleManager *)
                          CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                          in_stack_fffffffffffffdb8);
      local_1d2 = ppVar3->second;
      if (pBVar4->handleType != FILTER) {
        local_1d2 = toggle_flag(in_stack_fffffffffffffda6,in_stack_fffffffffffffda0);
      }
      in_stack_fffffffffffffda4 = ppVar3->second;
      in_stack_fffffffffffffda6 = 0;
      in_stack_fffffffffffffdb4 = (uint)local_1d2;
      in_stack_fffffffffffffd98 = local_10;
      in_stack_fffffffffffffdb8 =
           (GlobalHandle)
           std::make_pair<helics::action_message_def::action_t,helics::action_message_def::action_t>
                     ((action_t *)local_10,(action_t *)0x5ecdf3);
      connectInterfaces(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                        in_stack_ffffffffffffff0c,in_stack_ffffffffffffff00,
                        in_stack_fffffffffffffefc,in_stack_ffffffffffffff20);
      __gnu_cxx::
      __normal_iterator<std::pair<helics::GlobalHandle,_unsigned_short>_*,_std::vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
      ::operator++(&local_1b0);
    }
  }
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  CLI::std::
  vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
  ::~vector((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
             *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  return;
}

Assistant:

void CoreBroker::findAndNotifyEndpointTargets(BasicHandleInfo& handleInfo, const std::string& key)
{
    auto uHandles = unknownHandles.checkForEndpoints(key);
    for (const auto& target : uHandles) {
        const auto* iface = handles.findHandle(target.first);
        auto destFlags = target.second;
        if (iface->handleType != InterfaceType::FILTER) {
            destFlags = toggle_flag(destFlags, destination_target);
        }

        connectInterfaces(handleInfo,
                          target.second,
                          *iface,

                          destFlags,
                          std::make_pair(CMD_ADD_ENDPOINT,
                                         (iface->handleType != InterfaceType::FILTER) ?
                                             CMD_ADD_ENDPOINT :
                                             CMD_ADD_FILTER));
    }

    auto eptTargets = unknownHandles.checkForEndpointLinks(key);
    for (const auto& ept : eptTargets) {
        ActionMessage link(CMD_ADD_NAMED_ENDPOINT);
        link.name(ept);
        link.setSource(handleInfo.handle);
        setActionFlag(link, destination_target);
        link.counter = static_cast<uint16_t>(InterfaceType::ENDPOINT);
        checkForNamedInterface(link);
    }

    if (!(uHandles.empty() && eptTargets.empty())) {
        unknownHandles.clearEndpoint(key);
    }

    if (getBrokerState() == BrokerState::OPERATING) {
        uHandles = unknownHandles.checkForReconnectionEndpoints(key);
        for (const auto& target : uHandles) {
            const auto* iface = handles.findHandle(target.first);
            auto destFlags = target.second;
            if (iface->handleType != InterfaceType::FILTER) {
                destFlags = toggle_flag(destFlags, destination_target);
            }

            connectInterfaces(handleInfo,
                              target.second,
                              *iface,

                              destFlags,
                              std::make_pair(CMD_ADD_ENDPOINT,
                                             (iface->handleType != InterfaceType::FILTER) ?
                                                 CMD_ADD_ENDPOINT :
                                                 CMD_ADD_FILTER));
        }
    }
}